

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::ConvertToSampledImagePass::GetSampledImageTypeForImage
          (ConvertToSampledImagePass *this,Instruction *image_variable)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  TypeManager *this_00;
  SampledImage sampled_image_type;
  Image image_type_for_sampled_image;
  Type local_98;
  Image *local_70;
  Image local_68;
  
  pTVar3 = GetVariableType(this,image_variable);
  uVar2 = 0;
  if (pTVar3 != (Type *)0x0) {
    iVar1 = (*pTVar3->_vptr_Type[0x12])(pTVar3);
    uVar2 = 0;
    if ((Image *)CONCAT44(extraout_var,iVar1) != (Image *)0x0) {
      analysis::Image::Image(&local_68,(Image *)CONCAT44(extraout_var,iVar1));
      local_98.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.kind_ = kSampledImage;
      local_98._vptr_Type = (_func_int **)&PTR__Type_008aca48;
      local_70 = &local_68;
      this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
      uVar2 = analysis::TypeManager::GetTypeInstruction(this_00,&local_98);
      analysis::Type::~Type(&local_98);
      analysis::Type::~Type(&local_68.super_Type);
    }
  }
  return uVar2;
}

Assistant:

uint32_t ConvertToSampledImagePass::GetSampledImageTypeForImage(
    Instruction* image_variable) {
  const auto* variable_type = GetVariableType(*image_variable);
  if (variable_type == nullptr) return 0;
  const auto* image_type = variable_type->AsImage();
  if (image_type == nullptr) return 0;

  analysis::Image image_type_for_sampled_image(*image_type);
  analysis::SampledImage sampled_image_type(&image_type_for_sampled_image);
  return context()->get_type_mgr()->GetTypeInstruction(&sampled_image_type);
}